

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O2

int __thiscall deqp::egl::anon_unknown_0::SyncTest::init(SyncTest *this,EVP_PKEY_CTX *ctx)

{
  Extension EVar1;
  NativeDisplay *pNVar2;
  SyncTest *pSVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  Extension EVar7;
  GLenum err;
  Library *pLVar8;
  NativeWindowFactory *pNVar9;
  EGLDisplay pvVar10;
  EGLConfig pvVar11;
  undefined4 extraout_var;
  istream *piVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  EGLSurface pvVar13;
  GLubyte *__s;
  NotSupportedError *pNVar14;
  uint uVar15;
  uint uVar16;
  byte bVar17;
  allocator<char> local_229;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  Extension local_204;
  NativeWindowFactory *local_200;
  Library *local_1f8;
  SyncTest *local_1f0;
  EGLint contextAttribList [3];
  EGLint displayAttribList [7];
  istringstream extensionStream;
  
  pLVar8 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pNVar9 = eglu::selectNativeWindowFactory
                     (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  displayAttribList[4] = 0x3021;
  displayAttribList[5] = 1;
  displayAttribList[6] = 0x3038;
  displayAttribList[0] = 0x3040;
  displayAttribList[1] = 4;
  displayAttribList[2] = 0x3033;
  displayAttribList[3] = 4;
  contextAttribList[0] = 0x3098;
  contextAttribList[1] = 2;
  contextAttribList[2] = 0x3038;
  pvVar10 = eglu::getAndInitDisplay
                      ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                       super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                       .m_data.ptr,(Version *)0x0);
  this->m_eglDisplay = pvVar10;
  pvVar11 = eglu::chooseSingleConfig(pLVar8,pvVar10,displayAttribList);
  this->m_eglConfig = pvVar11;
  EglTestContext::initGLFunctions((this->super_TestCase).m_eglTestCtx,&this->m_gl,(ApiType)0x2);
  EVar7 = (uint)(this->m_syncType == 0x30fa) << 2;
  if (this->m_syncType == 0x30f9) {
    EVar7 = EXTENSION_FENCE_SYNC;
  }
  EVar1 = this->m_extensions;
  iVar5 = (*pLVar8->_vptr_Library[0x2a])(pLVar8,this->m_eglDisplay,0x3055);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,(char *)CONCAT44(extraout_var,iVar5),&local_229);
  std::__cxx11::istringstream::istringstream
            ((istringstream *)&extensionStream,(string *)&local_228,_S_in);
  local_204 = EVar7 | EVar1;
  local_200 = pNVar9;
  local_1f0 = this;
  std::__cxx11::string::~string((string *)&local_228);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  local_1f8 = pLVar8;
  dVar6 = (*pLVar8->_vptr_Library[0x1f])(pLVar8);
  eglu::checkError(dVar6,"eglQueryString(display, EGL_EXTENSIONS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x81);
  uVar16 = 0;
  while( true ) {
    piVar12 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&extensionStream,(string *)&local_228,' ');
    pSVar3 = local_1f0;
    if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0) break;
    bVar4 = std::operator==(&local_228,"EGL_KHR_fence_sync");
    uVar15 = 2;
    if (!bVar4) {
      bVar4 = std::operator==(&local_228,"EGL_KHR_reusable_sync");
      uVar15 = 4;
      if (!bVar4) {
        bVar4 = std::operator==(&local_228,"EGL_KHR_wait_sync");
        uVar15 = (uint)bVar4;
      }
    }
    uVar16 = uVar16 | uVar15;
  }
  EVar7 = local_204 & ~uVar16;
  if ((EVar7 & EXTENSION_FENCE_SYNC) == EXTENSION_NONE) {
    if ((EVar7 & EXTENSION_REUSABLE_SYNC) == EXTENSION_NONE) {
      if ((EVar7 & EXTENSION_WAIT_SYNC) == EXTENSION_NONE) {
        std::__cxx11::string::~string((string *)&local_228);
        iVar5 = std::__cxx11::istringstream::~istringstream((istringstream *)&extensionStream);
        pLVar8 = local_1f8;
        if (pSVar3->m_useCurrentContext == true) {
          (**local_1f8->_vptr_Library)(local_1f8,0x30a0);
          dVar6 = (*pLVar8->_vptr_Library[0x1f])(pLVar8);
          eglu::checkError(dVar6,"bindAPI(EGL_OPENGL_ES_API)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                           ,0xd9);
          iVar5 = (*pLVar8->_vptr_Library[6])(pLVar8,pSVar3->m_eglDisplay,pSVar3->m_eglConfig,0);
          pSVar3->m_eglContext = (EGLContext)CONCAT44(extraout_var_00,iVar5);
          dVar6 = (*pLVar8->_vptr_Library[0x1f])(pLVar8);
          eglu::checkError(dVar6,"Failed to create GLES2 context",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                           ,0xdb);
          pNVar2 = (((pSVar3->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                   super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.
                   m_data.ptr;
          pvVar10 = pSVar3->m_eglDisplay;
          pvVar11 = pSVar3->m_eglConfig;
          eglu::parseWindowVisibility
                    (((pSVar3->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
          _extensionStream = 0x1e0000001e0;
          iVar5 = (*(local_200->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                            (local_200,pNVar2,pvVar10,pvVar11);
          pSVar3->m_nativeWindow = (NativeWindow *)CONCAT44(extraout_var_01,iVar5);
          pvVar13 = eglu::createWindowSurface
                              ((((pSVar3->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                               super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                               .m_data.ptr,(NativeWindow *)CONCAT44(extraout_var_01,iVar5),
                               pSVar3->m_eglDisplay,pSVar3->m_eglConfig,(EGLAttrib *)0x0);
          pSVar3->m_eglSurface = pvVar13;
          (*pLVar8->_vptr_Library[0x27])
                    (pLVar8,pSVar3->m_eglDisplay,pvVar13,pvVar13,pSVar3->m_eglContext);
          dVar6 = (*pLVar8->_vptr_Library[0x1f])(pLVar8);
          eglu::checkError(dVar6,
                           "makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                           ,0xe1);
          __s = (*(pSVar3->m_gl).getString)(0x1f03);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_228,(char *)__s,&local_229);
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&extensionStream,(string *)&local_228,_S_in);
          std::__cxx11::string::~string((string *)&local_228);
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          local_228._M_string_length = 0;
          local_228.field_2._M_local_buf[0] = '\0';
          err = (*(pSVar3->m_gl).getError)();
          glu::checkError(err,"glGetString(GL_EXTENSIONS)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                          ,0xa1);
          bVar17 = 0;
          while( true ) {
            piVar12 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)&extensionStream,(string *)&local_228,' ');
            if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0) break;
            bVar4 = std::operator==(&local_228,"GL_OES_EGL_sync");
            bVar17 = bVar17 | bVar4;
          }
          if (bVar17 == 0) {
            pNVar14 = (NotSupportedError *)__cxa_allocate_exception(0x38);
            tcu::NotSupportedError::NotSupportedError
                      (pNVar14,"GL_OES_EGL_sync not supported",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                       ,0xaa);
            __cxa_throw(pNVar14,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
          }
          std::__cxx11::string::~string((string *)&local_228);
          iVar5 = std::__cxx11::istringstream::~istringstream((istringstream *)&extensionStream);
        }
        return iVar5;
      }
      pNVar14 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar14,"EGL_KHR_wait_sync not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                 ,0x97);
    }
    else {
      pNVar14 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar14,"EGL_KHR_reusable_sync not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                 ,0x94);
    }
  }
  else {
    pNVar14 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar14,"EGL_KHR_fence_sync not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
               ,0x91);
  }
  __cxa_throw(pNVar14,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SyncTest::init (void)
{
	const Library&						egl				= m_eglTestCtx.getLibrary();
	const eglu::NativeWindowFactory&	windowFactory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

	const EGLint displayAttribList[] =
	{
		EGL_RENDERABLE_TYPE,	EGL_OPENGL_ES2_BIT,
		EGL_SURFACE_TYPE,		EGL_WINDOW_BIT,
		EGL_ALPHA_SIZE,			1,
		EGL_NONE
	};

	const EGLint contextAttribList[] =
	{
		EGL_CONTEXT_CLIENT_VERSION, 2,
		EGL_NONE
	};

	m_eglDisplay	= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_eglConfig		= eglu::chooseSingleConfig(egl, m_eglDisplay, displayAttribList);

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2,0));

	{
		const Extension syncTypeExtension = getSyncTypeExtension(m_syncType);
		requiredEGLExtensions(egl, m_eglDisplay, (Extension)(m_extensions | syncTypeExtension));
	}

	if (m_useCurrentContext)
	{
		// Create context
		EGLU_CHECK_CALL(egl, bindAPI(EGL_OPENGL_ES_API));
		m_eglContext = egl.createContext(m_eglDisplay, m_eglConfig, EGL_NO_CONTEXT, contextAttribList);
		EGLU_CHECK_MSG(egl, "Failed to create GLES2 context");

		// Create surface
		m_nativeWindow = windowFactory.createWindow(&m_eglTestCtx.getNativeDisplay(), m_eglDisplay, m_eglConfig, DE_NULL, eglu::WindowParams(480, 480, eglu::parseWindowVisibility(m_testCtx.getCommandLine())));
		m_eglSurface = eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *m_nativeWindow, m_eglDisplay, m_eglConfig, DE_NULL);

		EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext));

		requiredGLESExtensions(m_gl);
	}
}